

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self)

{
  Subtree self_00;
  Subtree *pSVar1;
  _Bool _Var2;
  ulong uVar3;
  ulong uVar4;
  SubtreeArray SVar5;
  SubtreeArray result;
  
  result.contents = (Subtree *)0x0;
  result.size = 0;
  result.capacity = 0;
  uVar4 = (ulong)self->size;
  while (pSVar1 = result.contents, uVar4 != 0) {
    self_00 = self->contents[uVar4 - 1];
    _Var2 = ts_subtree_extra(self_00);
    if (!_Var2) goto LAB_00118b9a;
    array__grow((VoidArray *)&result,8);
    uVar3 = result._8_8_ & 0xffffffff;
    result.size = result.size + 1;
    result.contents[uVar3] = self_00;
    uVar4 = uVar4 - 1;
  }
  uVar4 = 0;
LAB_00118b9a:
  self->size = (uint32_t)uVar4;
  ts_subtree_array_reverse(&result);
  SVar5.size = result.size;
  SVar5.capacity = result.capacity;
  SVar5.contents = pSVar1;
  return SVar5;
}

Assistant:

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self) {
  SubtreeArray result = array_new();

  uint32_t i = self->size - 1;
  for (; i + 1 > 0; i--) {
    Subtree child = self->contents[i];
    if (!ts_subtree_extra(child)) break;
    array_push(&result, child);
  }

  self->size = i + 1;
  ts_subtree_array_reverse(&result);
  return result;
}